

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303DLHC.cpp
# Opt level: O0

bool __thiscall RTIMUGD20HM303DLHC::setAccelCTRL1(RTIMUGD20HM303DLHC *this)

{
  uchar ctrl1;
  RTIMUGD20HM303DLHC *this_local;
  
  if ((((this->super_RTIMU).m_settings)->m_GD20HM303DLHCAccelSampleRate < 1) ||
     (7 < ((this->super_RTIMU).m_settings)->m_GD20HM303DLHCAccelSampleRate)) {
    fprintf(_stderr,"Illegal LSM303DLHC accel sample rate code %d\n",
            (ulong)(uint)((this->super_RTIMU).m_settings)->m_GD20HM303DLHCAccelSampleRate);
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ =
         RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_accelSlaveAddr
                            ,' ',(byte)(((this->super_RTIMU).m_settings)->
                                        m_GD20HM303DLHCAccelSampleRate << 4) | 7,
                            "Failed to set LSM303D CTRL1");
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUGD20HM303DLHC::setAccelCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_GD20HM303DLHCAccelSampleRate < 1) || (m_settings->m_GD20HM303DLHCAccelSampleRate > 7)) {
        HAL_ERROR1("Illegal LSM303DLHC accel sample rate code %d\n", m_settings->m_GD20HM303DLHCAccelSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_GD20HM303DLHCAccelSampleRate << 4) | 0x07;

    return m_settings->HALWrite(m_accelSlaveAddr,  LSM303DLHC_CTRL1_A, ctrl1, "Failed to set LSM303D CTRL1");
}